

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

void __thiscall
QTextDocumentPrivate::move(QTextDocumentPrivate *this,int pos,int to,int length,Operation op)

{
  FragmentMap *this_00;
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Header *pHVar6;
  QTextFragmentData *pQVar7;
  Header *pHVar8;
  uint uVar9;
  uint uVar10;
  uint p;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint f;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  quint32 pos_00;
  uint p_1;
  ulong uVar17;
  quint32 qVar18;
  long in_FS_OFFSET;
  bool bVar19;
  QTextUndoCommand local_78;
  QTextUndoCommand local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pos != to) {
    split(this,pos);
    split(this,length + pos);
    if (to == -1) {
      pos_00 = 0;
    }
    else {
      uVar11 = QFragmentMapData<QTextFragmentData>::findNode(&(this->fragments).data,to,0);
      pHVar6 = (this->fragments).data.field_0.head;
      pos_00 = *(quint32 *)((long)pHVar6 + (ulong)uVar11 * 0x20 + 0x10);
      uVar14 = *(uint *)((long)pHVar6 + (ulong)uVar11 * 0x20);
      while (uVar14 != 0) {
        puVar1 = (uint *)((long)pHVar6 + (ulong)uVar14 * 0x20);
        if (*(uint *)((long)pHVar6 + (ulong)uVar14 * 0x20 + 8) == uVar11) {
          pos_00 = pos_00 + puVar1[4] + puVar1[5];
        }
        uVar11 = uVar14;
        uVar14 = *puVar1;
      }
    }
    this_00 = &this->fragments;
    uVar11 = QFragmentMapData<QTextFragmentData>::findNode(&this_00->data,pos,0);
    uVar12 = QFragmentMapData<QTextFragmentData>::findNode(&this_00->data,length + pos,0);
    if (uVar11 != uVar12) {
      do {
        uVar13 = QFragmentMapData<QTextFragmentData>::next(&this_00->data,uVar11);
        pHVar6 = (this_00->data).field_0.head;
        uVar17 = (ulong)uVar11;
        qVar18 = *(quint32 *)((long)pHVar6 + uVar17 * 0x20 + 0x10);
        uVar14 = *(uint *)((long)pHVar6 + uVar17 * 0x20);
        while (uVar14 != 0) {
          puVar1 = (uint *)((long)pHVar6 + (ulong)uVar14 * 0x20);
          if (*(uint *)((long)pHVar6 + (ulong)uVar14 * 0x20 + 8) == uVar11) {
            qVar18 = qVar18 + puVar1[4] + puVar1[5];
          }
          uVar11 = uVar14;
          uVar14 = *puVar1;
        }
        uVar11 = QFragmentMapData<QTextBlockData>::findNode(&(this->blocks).data,qVar18 + 1,0);
        pQVar7 = (this->fragments).data.field_0.fragments;
        pHVar8 = (this->blocks).data.field_0.head;
        uVar16 = (ulong)uVar11;
        local_58.revision = *(int *)((long)pHVar8 + uVar16 * 0x48 + 0x44) * 2 >> 1;
        local_58.command = 1;
        local_78._2_1_ = this->editBlock != 0;
        local_78.operation = (quint8)op;
        uVar2 = pQVar7[uVar17].stringPosition;
        uVar4 = pQVar7[uVar17].format;
        local_58.field_8._4_4_ = 0xaaaaaaaa;
        local_58.field_8.blockFormat = pQVar7[uVar17].super_QFragment<1>.size_array[0];
        local_78.command = 0;
        local_58._28_4_ = 0xaaaaaaaa;
        uVar3 = pQVar7[uVar17].stringPosition;
        uVar5 = pQVar7[uVar17].format;
        local_78.field_8._4_4_ = 0xaaaaaaaa;
        local_78.field_8.blockFormat = pQVar7[uVar17].super_QFragment<1>.size_array[0];
        local_78._28_4_ = 0xaaaaaaaa;
        local_78.revision = local_58.revision;
        iVar15 = *(int *)((long)pHVar8 + uVar16 * 0x48 + 0x10);
        uVar10 = *(uint *)((long)pHVar8 + uVar16 * 0x48);
        uVar14 = uVar11;
        while (uVar9 = uVar10, uVar9 != 0) {
          puVar1 = (uint *)((long)pHVar8 + (ulong)uVar9 * 0x48);
          if (puVar1[2] == uVar14) {
            iVar15 = iVar15 + puVar1[4] + puVar1[7];
          }
          uVar14 = uVar9;
          uVar10 = *puVar1;
        }
        local_78.format = uVar5;
        local_78.strPos = uVar3;
        local_78.pos = pos_00;
        local_58._2_1_ = local_78._2_1_;
        local_58.operation = local_78.operation;
        local_58.format = uVar4;
        local_58.strPos = uVar2;
        local_58.pos = qVar18;
        if (qVar18 + 1 == iVar15) {
          uVar11 = QFragmentMapData<QTextBlockData>::previous(&(this->blocks).data,uVar11);
          bVar19 = (this->blocks).data.field_0.fragments[uVar11].super_QFragment<3>.size_array[0] ==
                   1;
          local_58.command = bVar19 + 5 + (ushort)bVar19;
          f = remove_block(this,qVar18,&local_58.field_8.blockFormat,6,op);
          qVar18 = pos_00;
          if (to != -1) {
            qVar18 = pos_00 + 1;
            insert_block(this,pos_00,pQVar7[uVar17].stringPosition,pQVar7[uVar17].format,
                         local_58.field_8.blockFormat,op,5);
            bVar19 = (this->blocks).data.field_0.fragments[uVar11].super_QFragment<3>.size_array[0]
                     == 1;
            local_78.command = bVar19 + 4 + (ushort)bVar19;
            local_78.field_8.blockFormat = local_58.field_8.blockFormat;
          }
          appendUndoItem(this,&local_58);
          pos_00 = qVar18;
        }
        else {
          f = remove_string(this,qVar18,pQVar7[uVar17].super_QFragment<1>.size_array[0],op);
          if (to != -1) {
            insert_string(this,pos_00,pQVar7[uVar17].stringPosition,
                          pQVar7[uVar17].super_QFragment<1>.size_array[0],pQVar7[uVar17].format,op);
            pos_00 = pos_00 + pQVar7[uVar17].super_QFragment<1>.size_array[0];
          }
          appendUndoItem(this,&local_58);
          *(uint *)((long)pHVar8 + uVar16 * 0x48 + 0x44) =
               *(uint *)((long)pHVar8 + uVar16 * 0x48 + 0x44) & 0x80000000 |
               this->revision & 0x7fffffffU;
        }
        if (to != -1) {
          appendUndoItem(this,&local_78);
        }
        uVar11 = uVar13;
      } while (uVar13 != uVar12);
      if (f != 0) {
        unite(this,f);
      }
    }
    if ((this->field_0x294 & 2) == 0) {
      finishEdit(this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentPrivate::move(int pos, int to, int length, QTextUndoCommand::Operation op)
{
    Q_ASSERT(to <= fragments.length() && to <= pos);
    Q_ASSERT(pos >= 0 && pos+length <= fragments.length());
    Q_ASSERT(blocks.length() == fragments.length());

    if (pos == to)
        return;

    const bool needsInsert = to != -1;

#if !defined(QT_NO_DEBUG)
    const bool startAndEndInSameFrame = (frameAt(pos) == frameAt(pos + length - 1));

    const bool endIsEndOfChildFrame = (isAncestorFrame(frameAt(pos), frameAt(pos + length - 1))
                                       && text.at(find(pos + length - 1)->stringPosition) == QTextEndOfFrame);

    const bool startIsStartOfFrameAndEndIsEndOfFrameWithCommonParent
               = (text.at(find(pos)->stringPosition) == QTextBeginningOfFrame
                  && text.at(find(pos + length - 1)->stringPosition) == QTextEndOfFrame
                  && frameAt(pos)->parentFrame() == frameAt(pos + length - 1)->parentFrame());

    const bool isFirstTableCell = (qobject_cast<QTextTable *>(frameAt(pos + length - 1))
                                  && frameAt(pos + length - 1)->parentFrame() == frameAt(pos));

    Q_ASSERT(startAndEndInSameFrame || endIsEndOfChildFrame || startIsStartOfFrameAndEndIsEndOfFrameWithCommonParent || isFirstTableCell);
#endif

    split(pos);
    split(pos+length);

    uint dst = needsInsert ? fragments.findNode(to) : 0;
    uint dstKey = needsInsert ? fragments.position(dst) : 0;

    uint x = fragments.findNode(pos);
    uint end = fragments.findNode(pos+length);

    uint w = 0;
    while (x != end) {
        uint n = fragments.next(x);

        uint key = fragments.position(x);
        uint b = blocks.findNode(key+1);
        QTextBlockData *B = blocks.fragment(b);
        int blockRevision = B->revision;

        QTextFragmentData *X = fragments.fragment(x);
        QT_INIT_TEXTUNDOCOMMAND(c, QTextUndoCommand::Removed, (editBlock != 0),
                                op, X->format, X->stringPosition, key, X->size_array[0],
                                blockRevision);
        QT_INIT_TEXTUNDOCOMMAND(cInsert, QTextUndoCommand::Inserted, (editBlock != 0),
                                op, X->format, X->stringPosition, dstKey, X->size_array[0],
                                blockRevision);

        if (key+1 != blocks.position(b)) {
//          qDebug("remove_string from %d length %d", key, X->size_array[0]);
            Q_ASSERT(noBlockInString(QStringView{text}.mid(X->stringPosition, X->size_array[0])));
            w = remove_string(key, X->size_array[0], op);

            if (needsInsert) {
                insert_string(dstKey, X->stringPosition, X->size_array[0], X->format, op);
                dstKey += X->size_array[0];
            }
        } else {
//          qDebug("remove_block at %d", key);
            Q_ASSERT(X->size_array[0] == 1 && isValidBlockSeparator(text.at(X->stringPosition)));
            b = blocks.previous(b);
            B = nullptr;
            c.command = blocks.size(b) == 1 ? QTextUndoCommand::BlockDeleted : QTextUndoCommand::BlockRemoved;
            w = remove_block(key, &c.blockFormat, QTextUndoCommand::BlockAdded, op);

            if (needsInsert) {
                insert_block(dstKey++, X->stringPosition, X->format, c.blockFormat, op, QTextUndoCommand::BlockRemoved);
                cInsert.command = blocks.size(b) == 1 ? QTextUndoCommand::BlockAdded : QTextUndoCommand::BlockInserted;
                cInsert.blockFormat = c.blockFormat;
            }
        }
        appendUndoItem(c);
        if (B)
            B->revision = revision;
        x = n;

        if (needsInsert)
            appendUndoItem(cInsert);
    }
    if (w)
        unite(w);

    Q_ASSERT(blocks.length() == fragments.length());

    if (!blockCursorAdjustment)
        finishEdit();
}